

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O0

void sf::priv::CloseDisplay(Display *display)

{
  long in_RDI;
  Lock lock;
  Lock *in_stack_ffffffffffffffe0;
  Mutex *in_stack_ffffffffffffffe8;
  Lock *in_stack_fffffffffffffff0;
  
  Lock::Lock(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  if (in_RDI == (anonymous_namespace)::sharedDisplay) {
    (anonymous_namespace)::referenceCount = (anonymous_namespace)::referenceCount + -1;
    if ((anonymous_namespace)::referenceCount == 0) {
      XCloseDisplay(in_RDI);
    }
    Lock::~Lock(in_stack_ffffffffffffffe0);
    return;
  }
  __assert_fail("display == sharedDisplay",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Window/Unix/Display.cpp"
                ,0x51,"void sf::priv::CloseDisplay(Display *)");
}

Assistant:

void CloseDisplay(Display* display)
{
    Lock lock(mutex);

    assert(display == sharedDisplay);

    referenceCount--;
    if (referenceCount == 0)
        XCloseDisplay(display);
}